

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_electrocute(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  OBJ_DATA *obj;
  bool bVar1;
  int idam;
  uint uVar2;
  char *format;
  OBJ_DATA **ppOVar3;
  char *format_00;
  
  uVar2 = 0;
  ppOVar3 = (OBJ_DATA **)((long)vo + 0x98);
  while (obj = *ppOVar3, obj != (OBJ_DATA *)0x0) {
    if (-1 < obj->pIndexData->material_index) {
      bVar1 = is_worn(obj);
      if (bVar1) {
        uVar2 = uVar2 + (int)material_table[obj->pIndexData->material_index].mat_conductivity;
      }
    }
    ppOVar3 = &obj->next_content;
  }
  act("You attempt to send an electric current though $N\'s armor.",ch,(void *)0x0,vo,3);
  act("$n attempts to send an electric current though your armor.",ch,(void *)0x0,vo,2);
  act("$n attempts to send an electric current though $N\'s armor.",ch,(void *)0x0,vo,1);
  if (0 < (int)uVar2) {
    if (uVar2 < 0xf) {
      format_00 = "$n jerks slightly as $s armor crackles with electricity.";
      format = "You experience a brief jolt of pain as electricity hits your armor.";
    }
    else if (uVar2 < 0x1e) {
      format_00 = "$n convulses as bursts of electricity explode through $s armor!";
      format = "Your body is wracked with pain as electricity surges through you!";
    }
    else {
      format = 
      "Every inch of your body explodes with pain, your flesh melting as electricity courses into your body!"
      ;
      if (uVar2 < 0x2d) {
        format = 
        "You open your mouth in a silent scream as raw electricity explodes through your joints!";
      }
      format_00 = 
      "$n lets out a horrible shriek as the electric current roasts $m alive within $s armor!";
      if (uVar2 < 0x2d) {
        format_00 = "$n\'s face contorts in agony as $e convulses, briefly paralyzed!";
      }
    }
    act(format,(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,3);
    act(format_00,(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    idam = dice((level / 0xf) * uVar2,4);
    damage_new(ch,(CHAR_DATA *)vo,idam,sn,6,true,false,0,1,(char *)0x0);
    LAG_CHAR((CHAR_DATA *)vo,(uVar2 / 0xf) * 0xc);
    return;
  }
  act("Your armor harmlessly absorbs the electric charge.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,3
     );
  act("$n\'s armor harmlessly absorbs the electric charge.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,
      0);
  return;
}

Assistant:

void spell_electrocute(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	OBJ_DATA *obj;
	int tconduct = 0;

	for (obj = victim->carrying; obj != nullptr; obj = obj->next_content)
	{
		if (obj->pIndexData->material_index < 0)
			continue;

		if (!is_worn(obj))
			continue;

		tconduct += material_table[obj->pIndexData->material_index].mat_conductivity;
	}

	act("You attempt to send an electric current though $N's armor.", ch, 0, victim, TO_CHAR);
	act("$n attempts to send an electric current though your armor.", ch, 0, victim, TO_VICT);
	act("$n attempts to send an electric current though $N's armor.", ch, 0, victim, TO_NOTVICT);

	if (tconduct <= 0)
	{
		act("Your armor harmlessly absorbs the electric charge.", victim, 0, 0, TO_CHAR);
		act("$n's armor harmlessly absorbs the electric charge.", victim, 0, 0, TO_ROOM);
		return;
	}
	else if (tconduct < 15)
	{
		act("You experience a brief jolt of pain as electricity hits your armor.", victim, 0, 0, TO_CHAR);
		act("$n jerks slightly as $s armor crackles with electricity.", victim, 0, 0, TO_ROOM);
	}
	else if (tconduct < 30)
	{
		act("Your body is wracked with pain as electricity surges through you!", victim, 0, 0, TO_CHAR);
		act("$n convulses as bursts of electricity explode through $s armor!", victim, 0, 0, TO_ROOM);
	}
	else if (tconduct < 45)
	{
		act("You open your mouth in a silent scream as raw electricity explodes through your joints!", victim, 0, 0, TO_CHAR);
		act("$n's face contorts in agony as $e convulses, briefly paralyzed!", victim, 0, 0, TO_ROOM);
	}
	else
	{
		act("Every inch of your body explodes with pain, your flesh melting as electricity courses into your body!", victim, 0, 0, TO_CHAR);
		act("$n lets out a horrible shriek as the electric current roasts $m alive within $s armor!", victim, 0, 0, TO_ROOM);
	}

	damage_new(ch, victim, dice((level / 15) * tconduct, 4), sn, DAM_LIGHTNING, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);
	LAG_CHAR(victim, (tconduct / 15) * PULSE_VIOLENCE);
}